

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  __node_base_ptr *pp_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint *puVar3;
  ulong uVar4;
  string s;
  coda_cache<int,_int> cache;
  string local_a0;
  int local_7c;
  coda_cache<int,_int> local_78;
  
  puts("Test 1: check that elements in cache with time_max == 0 do not expire");
  pp_Var1 = &local_78.data._M_h._M_single_bucket;
  local_78.data._M_h._M_bucket_count = 1;
  local_78.data._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78.data._M_h._M_element_count = 0;
  local_78.data._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_78.data._M_h._M_rehash_policy._M_next_resize = 0;
  local_78.data._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_78.begp = (data_value_t *)0x0;
  local_78.endp = (data_value_t *)0x0;
  local_78.size_cur = 0;
  local_78.size_max = 0x400;
  local_78.time_max = 0;
  local_a0._M_dataplus._M_p._0_4_ = 0;
  local_7c = 0x17;
  local_78.data._M_h._M_buckets = pp_Var1;
  coda_cache<int,_int>::set(&local_78,(int *)&local_a0,&local_7c,false);
  local_a0._M_dataplus._M_p._0_4_ = 0;
  puVar3 = (uint *)coda_cache<int,_int>::get(&local_78,(int *)&local_a0);
  if (puVar3 == (uint *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)*puVar3;
  }
  printf("right after insert got %d\n",uVar4);
  sleep(1);
  local_a0._M_dataplus._M_p._0_4_ = 0;
  puVar3 = (uint *)coda_cache<int,_int>::get(&local_78,(int *)&local_a0);
  if (puVar3 == (uint *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)*puVar3;
  }
  printf("one second later got %d\n",uVar4);
  sleep(3);
  local_a0._M_dataplus._M_p = (pointer)((ulong)local_a0._M_dataplus._M_p._4_4_ << 0x20);
  puVar3 = (uint *)coda_cache<int,_int>::get(&local_78,(int *)&local_a0);
  if (puVar3 == (uint *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)*puVar3;
  }
  printf("three more seconds later got %d\n",uVar4);
  paVar2 = &local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  coda_cache<int,_int>::dbg(&local_78,&local_a0,1);
  printf("dbg: %s\n",local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_coda_cache<int,_int>::elem_t>,_std::allocator<std::pair<const_int,_coda_cache<int,_int>::elem_t>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_coda_cache<int,_int>::elem_t>,_std::allocator<std::pair<const_int,_coda_cache<int,_int>::elem_t>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_78);
  puts("Test 2: check that elements in cache with time_max = 1 expire after one second");
  local_78.data._M_h._M_bucket_count = 1;
  local_78.data._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78.data._M_h._M_element_count = 0;
  local_78.data._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_78.data._M_h._M_rehash_policy._M_next_resize = 0;
  local_78.data._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_78.begp = (data_value_t *)0x0;
  local_78.endp = (data_value_t *)0x0;
  local_78.size_cur = 0;
  local_78.size_max = 0x400;
  local_78.time_max = 1;
  local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p & 0xffffffff00000000;
  local_7c = 0x23;
  local_78.data._M_h._M_buckets = pp_Var1;
  coda_cache<int,_int>::set(&local_78,(int *)&local_a0,&local_7c,false);
  local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p & 0xffffffff00000000;
  puVar3 = (uint *)coda_cache<int,_int>::get(&local_78,(int *)&local_a0);
  if (puVar3 == (uint *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)*puVar3;
  }
  printf("right after insert got %d\n",uVar4);
  sleep(1);
  local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p & 0xffffffff00000000;
  puVar3 = (uint *)coda_cache<int,_int>::get(&local_78,(int *)&local_a0);
  if (puVar3 == (uint *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)*puVar3;
  }
  printf("one second later got %d\n",uVar4);
  sleep(3);
  local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p & 0xffffffff00000000;
  puVar3 = (uint *)coda_cache<int,_int>::get(&local_78,(int *)&local_a0);
  if (puVar3 == (uint *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)*puVar3;
  }
  printf("three more seconds later got %d\n",uVar4);
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  coda_cache<int,_int>::dbg(&local_78,&local_a0,1);
  printf("dbg: %s\n",local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_coda_cache<int,_int>::elem_t>,_std::allocator<std::pair<const_int,_coda_cache<int,_int>::elem_t>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_coda_cache<int,_int>::elem_t>,_std::allocator<std::pair<const_int,_coda_cache<int,_int>::elem_t>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_78);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	/* TEST 1 */
	{
		printf("Test 1: check that elements in cache with time_max == 0 do not expire\n");

		coda_cache<int, int> cache (1024, 0);
		cache.set(0, 23, false);
		const int *v = cache.get(0);
		printf("right after insert got %d\n", (int) (v ? *v : 0));

		sleep(1);
		v = cache.get(0);
		printf("one second later got %d\n", (int) (v ? *v : 0));

		sleep(3);
		v = cache.get(0);
		printf("three more seconds later got %d\n", (int) (v ? *v : 0));

		std::string s;
		cache.dbg(s, 1);
		printf("dbg: %s\n", s.c_str());
	}

	/* TEST 2 */
	{
		printf("Test 2: check that elements in cache with time_max = 1 expire after one second\n");

		coda_cache<int, int> cache (1024, 1);
		cache.set(0, 35, false);
		const int *v = cache.get(0);
		printf("right after insert got %d\n", (int) (v ? *v : 0));

		sleep(1);
		v = cache.get(0);
		printf("one second later got %d\n", (int) (v ? *v : 0));

		sleep(3);
		v = cache.get(0);
		printf("three more seconds later got %d\n", (int) (v ? *v : 0));

		std::string s;
		cache.dbg(s, 1);
		printf("dbg: %s\n", s.c_str());
	}

#if 0
	coda_cache<int, int> cache (1024 * 1024, 86400);

	cache.set(0, 23, false);
	cache.set(1, 32, true);

	std::string dbg;
	cache.dbg(dbg, 1);

	printf("%s\n", dbg.c_str());

#if 1
	// std::vector<long double> v (5);
	std::string v = "12345";

	printf("%u\n", (unsigned) estimate_capacity(v));

	printf("sizeof(std::string)=%u\n", (unsigned) sizeof(std::string));
	printf("sizeof(std::vector<int>)=%u\n", (unsigned) sizeof(std::vector<int>));
	printf("sizeof(std::map<std::string,custom_type>)=%u\n", (unsigned) sizeof(std::map<std::string,custom_type>));
	printf("sizeof(std::map<std::string,custom_type>::value_type)=%u\n", (unsigned) sizeof(std::map<std::string,custom_type>::value_type));
	printf("sizeof(std::pair<std::string,custom_type>)=%u\n", (unsigned) sizeof(std::pair<std::string,custom_type>));
#endif
#endif

	return 0;
}